

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation.cc
# Opt level: O0

int webrtc::WebRtcAec_GetMetrics(void *handle,AecMetrics *metrics)

{
  undefined1 local_c8 [8];
  Stats a_nlp;
  Stats erle;
  Stats erl;
  Aec *self;
  int stmp;
  float dtmp;
  float kUpWeight;
  AecMetrics *metrics_local;
  void *handle_local;
  
  if (handle == (void *)0x0) {
    handle_local._4_4_ = -1;
  }
  else if (metrics == (AecMetrics *)0x0) {
    handle_local._4_4_ = 0x2ee3;
  }
  else if (*(short *)((long)handle + 0x24) == 0x2a) {
    WebRtcAec_GetEchoStats
              (*(AecCore **)((long)handle + 0x70),(Stats *)&erle.hicounter,(Stats *)&a_nlp.hicounter
               ,(Stats *)local_c8,&metrics->divergent_filter_fraction);
    (metrics->erl).instant = (int)(float)erle.hicounter;
    if ((erl.sum <= -100.0) || (erle.hicounter._4_4_ <= -100.0)) {
      (metrics->erl).average = -100;
    }
    else {
      (metrics->erl).average = (int)(erl.sum * 0.7 + erle.hicounter._4_4_ * 0.3);
    }
    (metrics->erl).max = (int)erl.average;
    if (100.0 <= erl.instant) {
      (metrics->erl).min = -100;
    }
    else {
      (metrics->erl).min = (int)erl.instant;
    }
    (metrics->erle).instant = (int)(float)a_nlp.hicounter;
    if ((erle.sum <= -100.0) || (a_nlp.hicounter._4_4_ <= -100.0)) {
      (metrics->erle).average = -100;
    }
    else {
      (metrics->erle).average = (int)(erle.sum * 0.7 + a_nlp.hicounter._4_4_ * 0.3);
    }
    (metrics->erle).max = (int)erle.average;
    if (100.0 <= erle.instant) {
      (metrics->erle).min = -100;
    }
    else {
      (metrics->erle).min = (int)erle.instant;
    }
    if (((metrics->erl).average < -99) || ((metrics->erle).average < -99)) {
      self._4_4_ = -100;
    }
    else {
      self._4_4_ = (metrics->erl).average + (metrics->erle).average;
    }
    (metrics->rerl).average = self._4_4_;
    (metrics->rerl).instant = self._4_4_;
    (metrics->rerl).max = self._4_4_;
    (metrics->rerl).min = self._4_4_;
    (metrics->aNlp).instant = (int)(float)local_c8._0_4_;
    if ((a_nlp.sum <= -100.0) || ((float)local_c8._4_4_ <= -100.0)) {
      (metrics->aNlp).average = -100;
    }
    else {
      (metrics->aNlp).average = (int)(a_nlp.sum * 0.7 + (float)local_c8._4_4_ * 0.3);
    }
    (metrics->aNlp).max = (int)a_nlp.average;
    if (100.0 <= a_nlp.instant) {
      (metrics->aNlp).min = -100;
    }
    else {
      (metrics->aNlp).min = (int)a_nlp.instant;
    }
    handle_local._4_4_ = 0;
  }
  else {
    handle_local._4_4_ = 0x2ee2;
  }
  return handle_local._4_4_;
}

Assistant:

int WebRtcAec_GetMetrics(void* handle, AecMetrics* metrics) {
  const float kUpWeight = 0.7f;
  float dtmp;
  int stmp;
  Aec* self = reinterpret_cast<Aec*>(handle);
  Stats erl;
  Stats erle;
  Stats a_nlp;

  if (handle == NULL) {
    return -1;
  }
  if (metrics == NULL) {
    return AEC_NULL_POINTER_ERROR;
  }
  if (self->initFlag != initCheck) {
    return AEC_UNINITIALIZED_ERROR;
  }

  WebRtcAec_GetEchoStats(self->aec, &erl, &erle, &a_nlp,
                         &metrics->divergent_filter_fraction);

  // ERL
  metrics->erl.instant = static_cast<int>(erl.instant);

  if ((erl.himean > kOffsetLevel) && (erl.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * erl.himean + (1 - kUpWeight) * erl.average;
    metrics->erl.average = static_cast<int>(dtmp);
  } else {
    metrics->erl.average = kOffsetLevel;
  }

  metrics->erl.max = static_cast<int>(erl.max);

  if (erl.min < (kOffsetLevel * (-1))) {
    metrics->erl.min = static_cast<int>(erl.min);
  } else {
    metrics->erl.min = kOffsetLevel;
  }

  // ERLE
  metrics->erle.instant = static_cast<int>(erle.instant);

  if ((erle.himean > kOffsetLevel) && (erle.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * erle.himean + (1 - kUpWeight) * erle.average;
    metrics->erle.average = static_cast<int>(dtmp);
  } else {
    metrics->erle.average = kOffsetLevel;
  }

  metrics->erle.max = static_cast<int>(erle.max);

  if (erle.min < (kOffsetLevel * (-1))) {
    metrics->erle.min = static_cast<int>(erle.min);
  } else {
    metrics->erle.min = kOffsetLevel;
  }

  // RERL
  if ((metrics->erl.average > kOffsetLevel) &&
      (metrics->erle.average > kOffsetLevel)) {
    stmp = metrics->erl.average + metrics->erle.average;
  } else {
    stmp = kOffsetLevel;
  }
  metrics->rerl.average = stmp;

  // No other statistics needed, but returned for completeness.
  metrics->rerl.instant = stmp;
  metrics->rerl.max = stmp;
  metrics->rerl.min = stmp;

  // A_NLP
  metrics->aNlp.instant = static_cast<int>(a_nlp.instant);

  if ((a_nlp.himean > kOffsetLevel) && (a_nlp.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * a_nlp.himean + (1 - kUpWeight) * a_nlp.average;
    metrics->aNlp.average = static_cast<int>(dtmp);
  } else {
    metrics->aNlp.average = kOffsetLevel;
  }

  metrics->aNlp.max = static_cast<int>(a_nlp.max);

  if (a_nlp.min < (kOffsetLevel * (-1))) {
    metrics->aNlp.min = static_cast<int>(a_nlp.min);
  } else {
    metrics->aNlp.min = kOffsetLevel;
  }

  return 0;
}